

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

void dummy_Op_CompoundStringCloneForAppending(void)

{
  return;
}

Assistant:

bool Js::VarIsImpl<CompoundString>(RecyclableObject * object)
    {
        bool result = VirtualTableInfo<CompoundString>::HasVirtualTable(object);
#if DBG
        if (result)
        {
            CompoundString *const cs = static_cast<CompoundString *>(object);
            Assert(!cs->IsFinalized());
        }
#endif
        return result;
    }